

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O3

string * __thiscall
gutil::anon_unknown_4::getValue(string *__return_storage_ptr__,anon_unknown_4 *this,string *s)

{
  ulong uVar1;
  string *extraout_RAX;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&s->_M_dataplus);
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x23);
  if (uVar1 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  trim(__return_storage_ptr__);
  return extraout_RAX;
}

Assistant:

std::string getValue(const std::string &s)
{
  std::string ret=s;
  size_t pos=ret.find('#');

  if (pos < ret.size())
  {
    ret=ret.substr(0, pos);
  }

  trim(ret);

  return ret;
}